

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_compress.hpp
# Opt level: O1

void __thiscall
duckdb::AlpRDCompressionState<double>::Append
          (AlpRDCompressionState<double> *this,UnifiedVectorFormat *vdata,idx_t count)

{
  data_ptr_t pdVar1;
  unsigned_long *puVar2;
  sel_t *psVar3;
  EXACT_TYPE EVar4;
  ulong uVar5;
  idx_t iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  idx_t idx_in_entry;
  long lVar10;
  long lVar11;
  
  if (count != 0) {
    pdVar1 = vdata->data;
    lVar11 = 0;
    do {
      iVar6 = this->vector_idx;
      uVar7 = 0x400 - iVar6;
      if (count <= 0x400 - iVar6) {
        uVar7 = count;
      }
      puVar2 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        if (iVar6 != 0x400) {
          psVar3 = vdata->sel->sel_vector;
          lVar8 = 0;
          do {
            if (psVar3 == (sel_t *)0x0) {
              uVar9 = lVar8 + lVar11;
            }
            else {
              uVar9 = (ulong)psVar3[lVar11 + lVar8];
            }
            this->input_vector[this->vector_idx + lVar8] = *(EXACT_TYPE *)(pdVar1 + uVar9 * 8);
            lVar8 = lVar8 + 1;
          } while (uVar7 + (uVar7 == 0) != lVar8);
        }
      }
      else if (iVar6 != 0x400) {
        psVar3 = vdata->sel->sel_vector;
        lVar8 = 0;
        do {
          if (psVar3 == (sel_t *)0x0) {
            uVar9 = lVar8 + lVar11;
          }
          else {
            uVar9 = (ulong)psVar3[lVar11 + lVar8];
          }
          EVar4 = *(EXACT_TYPE *)(pdVar1 + uVar9 * 8);
          uVar5 = puVar2[uVar9 >> 6];
          lVar10 = this->vector_idx + lVar8;
          iVar6 = this->nulls_idx;
          this->vector_null_positions[iVar6] = (uint16_t)lVar10;
          this->nulls_idx = (iVar6 + 1) - (ulong)((uVar5 >> (uVar9 & 0x3f) & 1) != 0);
          this->input_vector[lVar10] = EVar4;
          lVar8 = lVar8 + 1;
        } while (uVar7 + (uVar7 == 0) != lVar8);
      }
      iVar6 = this->vector_idx + uVar7;
      this->vector_idx = iVar6;
      if (iVar6 == 0x400) {
        CompressVector(this);
      }
      lVar11 = lVar11 + uVar7;
      count = count - uVar7;
    } while (count != 0);
  }
  return;
}

Assistant:

void Append(UnifiedVectorFormat &vdata, idx_t count) {
		auto data = UnifiedVectorFormat::GetData<T>(vdata);
		idx_t values_left_in_data = count;
		idx_t offset_in_data = 0;
		while (values_left_in_data > 0) {
			// We calculate until which value in data we must go to fill the input_vector
			// to avoid checking if input_vector is filled in each iteration
			auto values_to_fill_alp_input =
			    MinValue<idx_t>(AlpConstants::ALP_VECTOR_SIZE - vector_idx, values_left_in_data);
			if (vdata.validity.AllValid()) { //! We optimize a loop when there are no null
				for (idx_t i = 0; i < values_to_fill_alp_input; i++) {
					auto idx = vdata.sel->get_index(offset_in_data + i);
					EXACT_TYPE value = Load<EXACT_TYPE>(const_data_ptr_cast(&data[idx]));
					input_vector[vector_idx + i] = value;
				}
			} else {
				for (idx_t i = 0; i < values_to_fill_alp_input; i++) {
					auto idx = vdata.sel->get_index(offset_in_data + i);
					EXACT_TYPE value = Load<EXACT_TYPE>(const_data_ptr_cast(&data[idx]));
					bool is_null = !vdata.validity.RowIsValid(idx);
					//! We resolve null values with a predicated comparison
					vector_null_positions[nulls_idx] = UnsafeNumericCast<uint16_t>(vector_idx + i);
					nulls_idx += is_null;
					input_vector[vector_idx + i] = value;
				}
			}
			offset_in_data += values_to_fill_alp_input;
			values_left_in_data -= values_to_fill_alp_input;
			vector_idx += values_to_fill_alp_input;
			// We still need this check since we could have an incomplete input_vector at the end of data
			if (vector_idx == AlpConstants::ALP_VECTOR_SIZE) {
				CompressVector();
				D_ASSERT(vector_idx == 0);
			}
		}
	}